

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.cpp
# Opt level: O0

bool __thiscall SGParser::Generator::NFA::Create(NFA *this,NFA *n,uint newLexemeId)

{
  mapped_type pNVar1;
  bool bVar2;
  NFANode *this_00;
  reference ppNVar3;
  vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_> *this_01;
  reference ppNVar4;
  mapped_type *ppNVar5;
  reference ppNVar6;
  uint local_174;
  mapped_type local_128;
  mapped_type ptr_1;
  NFANode *fs;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
  *__range2_2;
  NFANode *ptr;
  iterator __end3;
  iterator __begin3;
  vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_> *__range3;
  mapped_type n2;
  NFANode *n1;
  iterator __end2_1;
  iterator __begin2_1;
  NodeSet *__range2_1;
  NFANode *igraph;
  iterator __end2;
  iterator __begin2;
  NodeSet *__range2;
  map<SGParser::Generator::NFANode_*,_SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<std::pair<SGParser::Generator::NFANode_*const,_SGParser::Generator::NFANode_*>_>_>
  pointerMap;
  undefined1 local_58 [8];
  NodeSet graph;
  uint newLexemeId_local;
  NFA *n_local;
  NFA *this_local;
  
  if (this->pStartState == (NFANode *)0x0) {
    if (n->pStartState == (NFANode *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      graph._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = newLexemeId;
      std::
      set<SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<SGParser::Generator::NFANode_*>_>
      ::set((set<SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<SGParser::Generator::NFANode_*>_>
             *)local_58);
      TraverseGraph(this,n->pStartState,
                    (set<SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<SGParser::Generator::NFANode_*>_>
                     *)local_58);
      std::
      map<SGParser::Generator::NFANode_*,_SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<std::pair<SGParser::Generator::NFANode_*const,_SGParser::Generator::NFANode_*>_>_>
      ::map((map<SGParser::Generator::NFANode_*,_SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<std::pair<SGParser::Generator::NFANode_*const,_SGParser::Generator::NFANode_*>_>_>
             *)&__range2);
      __end2 = std::
               set<SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<SGParser::Generator::NFANode_*>_>
               ::begin((set<SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<SGParser::Generator::NFANode_*>_>
                        *)local_58);
      igraph = (NFANode *)
               std::
               set<SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<SGParser::Generator::NFANode_*>_>
               ::end((set<SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<SGParser::Generator::NFANode_*>_>
                      *)local_58);
      while( true ) {
        bVar2 = std::operator!=(&__end2,(_Self *)&igraph);
        if (!bVar2) break;
        ppNVar3 = std::_Rb_tree_const_iterator<SGParser::Generator::NFANode_*>::operator*(&__end2);
        __range2_1 = (NodeSet *)*ppNVar3;
        this_00 = (NFANode *)operator_new(0x38);
        NFANode::NFANode(this_00);
        ppNVar5 = std::
                  map<SGParser::Generator::NFANode_*,_SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<std::pair<SGParser::Generator::NFANode_*const,_SGParser::Generator::NFANode_*>_>_>
                  ::operator[]((map<SGParser::Generator::NFANode_*,_SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<std::pair<SGParser::Generator::NFANode_*const,_SGParser::Generator::NFANode_*>_>_>
                                *)&__range2,(key_type *)&__range2_1);
        *ppNVar5 = this_00;
        std::_Rb_tree_const_iterator<SGParser::Generator::NFANode_*>::operator++(&__end2);
      }
      __end2_1 = std::
                 set<SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<SGParser::Generator::NFANode_*>_>
                 ::begin((set<SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<SGParser::Generator::NFANode_*>_>
                          *)local_58);
      n1 = (NFANode *)
           std::
           set<SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<SGParser::Generator::NFANode_*>_>
           ::end((set<SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<SGParser::Generator::NFANode_*>_>
                  *)local_58);
      while( true ) {
        bVar2 = std::operator!=(&__end2_1,(_Self *)&n1);
        if (!bVar2) break;
        ppNVar3 = std::_Rb_tree_const_iterator<SGParser::Generator::NFANode_*>::operator*(&__end2_1)
        ;
        n2 = *ppNVar3;
        ppNVar5 = std::
                  map<SGParser::Generator::NFANode_*,_SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<std::pair<SGParser::Generator::NFANode_*const,_SGParser::Generator::NFANode_*>_>_>
                  ::operator[]((map<SGParser::Generator::NFANode_*,_SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<std::pair<SGParser::Generator::NFANode_*const,_SGParser::Generator::NFANode_*>_>_>
                                *)&__range2,&n2);
        pNVar1 = *ppNVar5;
        pNVar1->AcceptingState = n2->AcceptingState;
        pNVar1->Id = n2->Id;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                  (&pNVar1->LinkChar,&n2->LinkChar);
        this_01 = &n2->LinkPtr;
        __end3 = std::
                 vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
                 ::begin(this_01);
        ptr = (NFANode *)
              std::
              vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
              ::end(this_01);
        while( true ) {
          bVar2 = __gnu_cxx::operator!=
                            (&__end3,(__normal_iterator<SGParser::Generator::NFANode_**,_std::vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>_>
                                      *)&ptr);
          if (!bVar2) break;
          ppNVar4 = __gnu_cxx::
                    __normal_iterator<SGParser::Generator::NFANode_**,_std::vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>_>
                    ::operator*(&__end3);
          __range2_2 = (vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
                        *)*ppNVar4;
          ppNVar5 = std::
                    map<SGParser::Generator::NFANode_*,_SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<std::pair<SGParser::Generator::NFANode_*const,_SGParser::Generator::NFANode_*>_>_>
                    ::operator[]((map<SGParser::Generator::NFANode_*,_SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<std::pair<SGParser::Generator::NFANode_*const,_SGParser::Generator::NFANode_*>_>_>
                                  *)&__range2,(key_type *)&__range2_2);
          std::
          vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>::
          push_back(&pNVar1->LinkPtr,ppNVar5);
          __gnu_cxx::
          __normal_iterator<SGParser::Generator::NFANode_**,_std::vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>_>
          ::operator++(&__end3);
        }
        std::_Rb_tree_const_iterator<SGParser::Generator::NFANode_*>::operator++(&__end2_1);
      }
      ppNVar5 = std::
                map<SGParser::Generator::NFANode_*,_SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<std::pair<SGParser::Generator::NFANode_*const,_SGParser::Generator::NFANode_*>_>_>
                ::operator[]((map<SGParser::Generator::NFANode_*,_SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<std::pair<SGParser::Generator::NFANode_*const,_SGParser::Generator::NFANode_*>_>_>
                              *)&__range2,&n->pStartState);
      this->pStartState = *ppNVar5;
      __end2_2 = std::
                 vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
                 ::begin(&n->FinalState);
      fs = (NFANode *)
           std::
           vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>::
           end(&n->FinalState);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          (&__end2_2,
                           (__normal_iterator<SGParser::Generator::NFANode_*const_*,_std::vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>_>
                            *)&fs);
        if (!bVar2) break;
        ppNVar6 = __gnu_cxx::
                  __normal_iterator<SGParser::Generator::NFANode_*const_*,_std::vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>_>
                  ::operator*(&__end2_2);
        ptr_1 = *ppNVar6;
        ppNVar5 = std::
                  map<SGParser::Generator::NFANode_*,_SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<std::pair<SGParser::Generator::NFANode_*const,_SGParser::Generator::NFANode_*>_>_>
                  ::operator[]((map<SGParser::Generator::NFANode_*,_SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<std::pair<SGParser::Generator::NFANode_*const,_SGParser::Generator::NFANode_*>_>_>
                                *)&__range2,&ptr_1);
        local_128 = *ppNVar5;
        if ((graph._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ != 0) &&
           (local_128->AcceptingState != 0)) {
          local_128->AcceptingState = graph._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
        }
        std::vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
        ::push_back(&this->FinalState,&local_128);
        __gnu_cxx::
        __normal_iterator<SGParser::Generator::NFANode_*const_*,_std::vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>_>
        ::operator++(&__end2_2);
      }
      if (graph._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ == 0) {
        local_174 = n->LexemeId;
      }
      else {
        local_174 = graph._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
      }
      this->LexemeId = local_174;
      this_local._7_1_ = true;
      std::
      map<SGParser::Generator::NFANode_*,_SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<std::pair<SGParser::Generator::NFANode_*const,_SGParser::Generator::NFANode_*>_>_>
      ::~map((map<SGParser::Generator::NFANode_*,_SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<std::pair<SGParser::Generator::NFANode_*const,_SGParser::Generator::NFANode_*>_>_>
              *)&__range2);
      std::
      set<SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<SGParser::Generator::NFANode_*>_>
      ::~set((set<SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<SGParser::Generator::NFANode_*>_>
              *)local_58);
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool NFA::Create(const NFA& n, unsigned newLexemeId) {
    // Make sure this NFA is empty
    if (pStartState)
        return false;
    // Can't copy an empty NFA
    if (!n.pStartState)
        return false;

    // Make a list of all nodes in n
    NodeSet graph;

    TraverseGraph(n.pStartState, graph);

    // Make a new node in this graph for all these nodes. Make a hash
    // that maps from the old pointer address to the new pointer address
    std::map<NFANode*, NFANode*> pointerMap;

    for (const auto igraph : graph)
        pointerMap[igraph] = new NFANode;

    // Go through all of the nodes in the old graph and copy them to
    // the new graph. Translate the pointers in the LinkPtr field
    // using the pointerMap created above
    for (const auto n1 : graph) {
        const auto n2 = pointerMap[n1];

        n2->AcceptingState = n1->AcceptingState;
        n2->Id             = n1->Id;
        n2->LinkChar       = n1->LinkChar;

        for (const auto ptr : n1->LinkPtr)
            n2->LinkPtr.push_back(pointerMap[ptr]);
    }

    // Set the start node equal to n1's start node
    pStartState = pointerMap[n.pStartState];

    // Copy/translate the final state std::vector
    for (const auto fs : n.FinalState) {
        const auto ptr = pointerMap[fs];

        if (newLexemeId && ptr->AcceptingState)
            ptr->AcceptingState = newLexemeId;

        FinalState.push_back(ptr);
    }

    LexemeId = newLexemeId ? newLexemeId : n.LexemeId;

    return true;
}